

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::remove_attributes(xml_node *this)

{
  bool bVar1;
  xml_allocator *this_00;
  xml_attribute_struct *in_RDI;
  xml_attribute_struct *next;
  xml_attribute_struct *attr;
  xml_allocator *alloc;
  xml_allocator *in_stack_ffffffffffffffc8;
  long local_20;
  bool local_1;
  
  if (in_RDI->header == 0) {
    local_1 = false;
  }
  else {
    this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>
                        ((xml_node_struct *)in_RDI->header);
    bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
    if (bVar1) {
      local_20 = *(long *)(in_RDI->header + 0x38);
      while (local_20 != 0) {
        local_20 = *(long *)(local_20 + 0x20);
        impl::anon_unknown_0::destroy_attribute(in_RDI,in_stack_ffffffffffffffc8);
      }
      *(undefined8 *)(in_RDI->header + 0x38) = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_attributes()
	{
		if (!_root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		for (xml_attribute_struct* attr = _root->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			impl::destroy_attribute(attr, alloc);

			attr = next;
		}

		_root->first_attribute = NULL;

		return true;
	}